

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolver.h
# Opt level: O2

void __thiscall chrono::ChSolver::~ChSolver(ChSolver *this)

{
  *(code **)this = chrono::ChVariablesGeneric::ChVariablesGeneric;
  std::__cxx11::string::~string((string *)(this + 0x30));
  std::__cxx11::string::~string((string *)(this + 0x10));
  return;
}

Assistant:

virtual ~ChSolver() {}